

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O2

bool __thiscall
Parser::try_parse_message<ParsedGame::LevelsTokenType>
          (Parser *this,
          vector<Token<ParsedGame::LevelsTokenType>,_std::allocator<Token<ParsedGame::LevelsTokenType>_>_>
          *tokens_array)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __tmp;
  pointer pcVar6;
  ci_equal equal_comp;
  string temp_buffer;
  allocator<char> local_ba;
  ci_equal local_b9;
  string local_b8;
  undefined1 local_98 [40];
  int local_70;
  string local_68 [32];
  string local_48 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"",(allocator<char> *)local_98);
  std::__cxx11::string::push_back((char)&local_b8);
  bVar4 = 1;
  while( true ) {
    bVar2 = (**(code **)((long)((this->m_text_provider)._M_t.
                                super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>
                                .super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                               _vptr_TextProvider + 0x10))();
    if ((bVar4 & bVar2) != 1) break;
    (**(code **)((long)((this->m_text_provider)._M_t.
                        super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>._M_t
                        .super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
                        super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                       _vptr_TextProvider + 0x18))();
    bVar3 = try_parse_return(this,false);
    bVar4 = 0;
    if ((!bVar3) &&
       (bVar4 = 0,
       ((this->m_text_provider)._M_t.
        super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>._M_t.
        super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
        super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->m_current_char != ' ')) {
      std::__cxx11::string::push_back((char)&local_b8);
      bVar4 = 1;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_98,"Message",&local_ba);
  bVar3 = ci_equal::operator()(&local_b9,(string *)local_98,&local_b8);
  std::__cxx11::string::~string((string *)local_98);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>(local_48,"",&local_ba);
    iVar1 = this->m_line_counter;
    local_98._0_4_ = MESSAGE;
    std::__cxx11::string::string((string *)(local_98 + 8),local_48);
    local_70 = iVar1;
    std::
    vector<Token<ParsedGame::LevelsTokenType>,std::allocator<Token<ParsedGame::LevelsTokenType>>>::
    emplace_back<Token<ParsedGame::LevelsTokenType>>
              ((vector<Token<ParsedGame::LevelsTokenType>,std::allocator<Token<ParsedGame::LevelsTokenType>>>
                *)tokens_array,(Token<ParsedGame::LevelsTokenType> *)local_98);
    std::__cxx11::string::~string((string *)(local_98 + 8));
    std::__cxx11::string::~string(local_48);
    local_b8._M_string_length = 0;
    *local_b8._M_dataplus._M_p = '\0';
    bVar5 = false;
    while( true ) {
      bVar4 = (**(code **)((long)((this->m_text_provider)._M_t.
                                  super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>
                                  .super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                                 _vptr_TextProvider + 0x10))();
      if (bVar5 != false || (~bVar4 & 1) != 0) break;
      (**(code **)((long)((this->m_text_provider)._M_t.
                          super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>
                          .super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                         _vptr_TextProvider + 0x18))();
      bVar5 = try_parse_return(this,false);
      if (bVar5) {
        (**(code **)((long)((this->m_text_provider)._M_t.
                            super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>
                            .super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                           _vptr_TextProvider + 0x20))();
      }
      else {
        std::__cxx11::string::push_back((char)&local_b8);
      }
    }
    std::__cxx11::string::string(local_68,(string *)&local_b8);
    iVar1 = this->m_line_counter;
    local_98._0_4_ = MessageContent;
    std::__cxx11::string::string((string *)(local_98 + 8),local_68);
    local_70 = iVar1;
    std::
    vector<Token<ParsedGame::LevelsTokenType>,std::allocator<Token<ParsedGame::LevelsTokenType>>>::
    emplace_back<Token<ParsedGame::LevelsTokenType>>
              ((vector<Token<ParsedGame::LevelsTokenType>,std::allocator<Token<ParsedGame::LevelsTokenType>>>
                *)tokens_array,(Token<ParsedGame::LevelsTokenType> *)local_98);
    std::__cxx11::string::~string((string *)(local_98 + 8));
    std::__cxx11::string::~string(local_68);
  }
  else {
    for (pcVar6 = local_b8._M_dataplus._M_p + local_b8._M_string_length;
        pcVar6 != local_b8._M_dataplus._M_p; pcVar6 = pcVar6 + -1) {
      (**(code **)((long)((this->m_text_provider)._M_t.
                          super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>
                          .super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                         _vptr_TextProvider + 0x20))();
    }
  }
  std::__cxx11::string::~string((string *)&local_b8);
  return bVar3;
}

Assistant:

bool try_parse_message(vector<Token<TokenType>>& tokens_array)
	{
		string temp_buffer = "";
		temp_buffer.push_back(m_text_provider->get_current_char());

		bool detected_word_end = false;
		while(m_text_provider->is_valid() && !detected_word_end)
		{
			m_text_provider->advance();
			if(try_parse_return(false))
			{
				detected_word_end = true;
			}
			else
			{
				switch(m_text_provider->get_current_char())
				{
					case ' ':
						detected_word_end = true;
					break;
					default:
						temp_buffer.push_back(m_text_provider->get_current_char());
					break;
				}
			}
		}

		ci_equal equal_comp;
		if(equal_comp("Message",temp_buffer))
		{
			//add token message and parse the rest
			tokens_array.push_back(Token<TokenType>(TokenType::MESSAGE,"",m_line_counter));

			temp_buffer.clear();

			detected_word_end = false;
			while(m_text_provider->is_valid() && !detected_word_end)
			{
				m_text_provider->advance();
				if(try_parse_return(false))
				{
					detected_word_end = true;
					m_text_provider->reverse();
				}
				else
				{
					temp_buffer.push_back(m_text_provider->get_current_char());
				}
			}
			tokens_array.push_back(Token<TokenType>(TokenType::MessageContent,temp_buffer,m_line_counter));

			return true;
		}
		else
		{
			//reverse everything and return false, we couldn't properly parse a message token
			for(auto it = temp_buffer.rbegin(); it != temp_buffer.rend(); it++)
			{
				m_text_provider->reverse();
			}
			return false;
		}
	}